

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.cpp
# Opt level: O2

int __thiscall
CVmObjTads::get_prop
          (CVmObjTads *this,vm_prop_id_t prop,vm_val_t *val,vm_obj_id_t self,vm_obj_id_t *source_obj
          ,uint *argc)

{
  int iVar1;
  int iVar2;
  undefined6 in_register_00000032;
  tadsobj_sc_search_ctx curpos;
  
  curpos.curhdr = (vm_tadsobj_hdr *)(this->super_CVmObject).ext_;
  curpos.path_sc = (tadsobj_objid_and_ptr *)0x0;
  curpos.cur = self;
  iVar1 = tadsobj_sc_search_ctx::find_prop
                    (&curpos,(uint)CONCAT62(in_register_00000032,prop),val,source_obj);
  iVar2 = 1;
  if (iVar1 == 0) {
    iVar1 = get_prop_intrinsic(this,prop,val,self,source_obj,argc);
    if (iVar1 == 0) {
      iVar2 = CVmObject::get_prop(&this->super_CVmObject,prop,val,self,source_obj,argc);
    }
  }
  return iVar2;
}

Assistant:

int CVmObjTads::get_prop(VMG_ vm_prop_id_t prop, vm_val_t *val,
                         vm_obj_id_t self, vm_obj_id_t *source_obj,
                         uint *argc)
{
    /* 
     *   try finding the property in my own direct property list or a
     *   superclass property list 
     */
    tadsobj_sc_search_ctx curpos(vmg_ self, this);
    if (curpos.find_prop(vmg_ prop, val, source_obj))
        return TRUE;

    /* 
     *   we didn't find the property in a property list, so try the
     *   intrinsic class methods
     */
    if (get_prop_intrinsic(vmg_ prop, val, self, source_obj, argc))
        return TRUE;

    /* 
     *   we didn't find the property among our methods, so try inheriting it
     *   from the base metaclass 
     */
    return CVmObject::get_prop(vmg_ prop, val, self, source_obj, argc);
}